

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O3

void __thiscall pool_tests::random_allocations::test_method(random_allocations *this)

{
  byte bVar1;
  void *pvVar2;
  uint uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  size_t bytes;
  long lVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  iterator pvVar12;
  size_t alignment;
  undefined8 *__src;
  long lVar13;
  ulong uVar14;
  PtrSizeAlignment *x;
  FastRandomContext *this_00;
  ulong uVar15;
  undefined8 *puVar16;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  void *ptr;
  PoolResource<128UL,_8UL> resource;
  check_type cVar17;
  undefined8 *local_1d8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  lazy_ostream local_160;
  undefined1 *local_150;
  char **local_148;
  assertion_result local_140;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  void *local_108;
  binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
  local_100;
  PoolResource<128UL,_8UL> local_f0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PoolResource<128UL,_8UL>::PoolResource(&local_f0,0x10000);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng;
  lVar10 = 0;
  __src = (undefined8 *)0x0;
  puVar16 = (undefined8 *)0x0;
  local_1d8 = (undefined8 *)0x0;
  do {
    if (__src == puVar16) {
LAB_00517579:
      do {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,3);
      } while (7 < uVar4);
      do {
        uVar5 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,8);
      } while (199 < uVar5);
      bVar1 = (byte)uVar4;
      alignment = 1L << (bVar1 & 0x3f);
      bytes = (uVar5 >> (bVar1 & 0x3f)) + 1 << (bVar1 & 0x3f);
      local_108 = PoolResource<128UL,_8UL>::Allocate(&local_f0,bytes,alignment);
      local_118 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_110 = "";
      local_128 = &boost::unit_test::basic_cstring<char_const>::null;
      local_120 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x89;
      file.m_begin = (iterator)&local_118;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_128,msg)
      ;
      local_100.m_lhs.m_value = &local_108;
      local_100.m_rhs = (void *)0x0;
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<void_*&>,_std::nullptr_t,_boost::test_tools::assertion::op::NE<void_*,_std::nullptr_t,_void>_>
      ::evaluate(&local_140,&local_100,false);
      local_170 = "ptr != nullptr";
      local_168 = "";
      local_160.m_empty = false;
      local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_150 = boost::unit_test::lazy_ostream::inst;
      local_148 = &local_170;
      local_180 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_178 = "";
      pvVar11 = (iterator)0x1;
      pvVar12 = (iterator)0xe;
      boost::test_tools::tt_detail::report_assertion
                (&local_140,&local_160,1,0xe,WARN,_cVar17,(size_t)&local_180,0x89);
      boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
      local_190 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_188 = "";
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_198 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x8a;
      file_00.m_begin = (iterator)&local_190;
      msg_00.m_end = pvVar12;
      msg_00.m_begin = pvVar11;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
                 msg_00);
      local_100.m_lhs.m_value = (void **)(alignment - 1 & (ulong)local_108);
      local_100.m_rhs = (void *)((ulong)local_100.m_rhs & 0xffffffff00000000);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
      ::evaluate(&local_140,
                 (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
                  *)&local_100,false);
      local_170 = "(reinterpret_cast<uintptr_t>(ptr) & (alignment - 1)) == 0";
      local_168 = "";
      local_160.m_empty = false;
      local_160._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
      local_150 = boost::unit_test::lazy_ostream::inst;
      local_148 = &local_170;
      local_1b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
      ;
      local_1a8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0xe;
      boost::test_tools::tt_detail::report_assertion
                (&local_140,&local_160,1,0xe,WARN,_cVar17,(size_t)&local_1b0,0x8a);
      boost::detail::shared_count::~shared_count(&local_140.m_message.pn);
      pvVar2 = local_108;
      if (puVar16 == local_1d8) {
        uVar15 = (long)puVar16 - (long)__src;
        if (uVar15 == 0x7ffffffffffffff8) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar8 = std::__throw_length_error("vector::_M_realloc_insert");
            if (__src != (undefined8 *)0x0) {
              operator_delete(__src,(long)local_1d8 - (long)__src);
            }
            PoolResource<128UL,_8UL>::~PoolResource(&local_f0);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar8);
            }
          }
          goto LAB_00517b0c;
        }
        lVar13 = (long)uVar15 >> 3;
        uVar14 = lVar13 * -0x5555555555555555;
        uVar6 = uVar14;
        if (__src == puVar16) {
          uVar6 = 1;
        }
        uVar9 = uVar6 + uVar14;
        if (0x555555555555554 < uVar9) {
          uVar9 = 0x555555555555555;
        }
        if (CARRY8(uVar6,uVar14)) {
          uVar9 = 0x555555555555555;
        }
        if (uVar9 == 0) {
          puVar7 = (undefined8 *)0x0;
        }
        else {
          puVar7 = (undefined8 *)operator_new(uVar9 * 0x18);
        }
        puVar7[lVar13] = pvVar2;
        puVar7[lVar13 + 1] = bytes;
        puVar7[lVar13 + 2] = alignment;
        if (0 < (long)uVar15) {
          memmove(puVar7,__src,uVar15);
        }
        if (__src != (undefined8 *)0x0) {
          operator_delete(__src,uVar15);
        }
        puVar16 = (undefined8 *)(uVar15 + (long)puVar7);
        local_1d8 = puVar7 + uVar9 * 3;
      }
      else {
        *puVar16 = local_108;
        puVar16[1] = bytes;
        puVar16[2] = alignment;
        puVar7 = __src;
      }
      puVar16 = puVar16 + 3;
      __src = puVar7;
    }
    else {
      do {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,2);
      } while (3 < uVar4);
      if (uVar4 != 0) goto LAB_00517579;
      uVar15 = ((long)puVar16 - (long)__src >> 3) * -0x5555555555555555 - 1;
      if (uVar15 == 0) {
        uVar3 = 0x40;
      }
      else {
        lVar13 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        uVar3 = (uint)lVar13 ^ 0x3f;
      }
      do {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,0x40 - uVar3);
      } while (uVar15 < uVar4);
      PoolResource<128UL,_8UL>::Deallocate
                (&local_f0,(void *)__src[uVar4 * 3],__src[uVar4 * 3 + 1],__src[uVar4 * 3 + 2]);
      __src[uVar4 * 3 + 2] = puVar16[-1];
      puVar7 = puVar16 + -3;
      uVar8 = puVar16[-2];
      puVar16 = puVar16 + -3;
      __src[uVar4 * 3] = *puVar7;
      (__src + uVar4 * 3)[1] = uVar8;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 1000);
  if (__src != puVar16) {
    puVar7 = __src;
    do {
      PoolResource<128UL,_8UL>::Deallocate(&local_f0,(void *)*puVar7,puVar7[1],puVar7[2]);
      puVar7 = puVar7 + 3;
    } while (puVar7 != puVar16);
  }
  PoolResourceTester::CheckAllDataAccountedFor<128ul,8ul>(&local_f0);
  if (__src != (undefined8 *)0x0) {
    operator_delete(__src,(long)local_1d8 - (long)__src);
  }
  PoolResource<128UL,_8UL>::~PoolResource(&local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00517b0c:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(random_allocations)
{
    struct PtrSizeAlignment {
        void* ptr;
        size_t bytes;
        size_t alignment;
    };

    // makes a bunch of random allocations and gives all of them back in random order.
    auto resource = PoolResource<128, 8>(65536);
    std::vector<PtrSizeAlignment> ptr_size_alignment{};
    for (size_t i = 0; i < 1000; ++i) {
        // make it a bit more likely to allocate than deallocate
        if (ptr_size_alignment.empty() || 0 != m_rng.randrange(4)) {
            // allocate a random item
            std::size_t alignment = std::size_t{1} << m_rng.randrange(8);          // 1, 2, ..., 128
            std::size_t size = (m_rng.randrange(200) / alignment + 1) * alignment; // multiple of alignment
            void* ptr = resource.Allocate(size, alignment);
            BOOST_TEST(ptr != nullptr);
            BOOST_TEST((reinterpret_cast<uintptr_t>(ptr) & (alignment - 1)) == 0);
            ptr_size_alignment.push_back({ptr, size, alignment});
        } else {
            // deallocate a random item
            auto& x = ptr_size_alignment[m_rng.randrange(ptr_size_alignment.size())];
            resource.Deallocate(x.ptr, x.bytes, x.alignment);
            x = ptr_size_alignment.back();
            ptr_size_alignment.pop_back();
        }
    }

    // deallocate all the rest
    for (auto const& x : ptr_size_alignment) {
        resource.Deallocate(x.ptr, x.bytes, x.alignment);
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}